

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::garbage_collector::async_run(garbage_collector *this,error_code *e)

{
  bool bVar1;
  element_type *peVar2;
  callback *c;
  error_code *in_RSI;
  long in_RDI;
  ptime pVar3;
  callback<void_(const_std::error_code_&)> *this_00;
  garbage_collector *in_stack_ffffffffffffffa8;
  callback<void_(const_std::error_code_&)> local_40 [2];
  longlong local_30;
  int local_28;
  longlong local_20;
  int local_18;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    c = (callback *)(in_RDI + 0x10);
    pVar3 = booster::ptime::seconds(0x486d86);
    local_30 = pVar3.sec;
    local_28 = pVar3.nsec;
    pVar3._8_8_ = local_30;
    pVar3.sec = (longlong)c;
    local_20 = local_30;
    local_18 = local_28;
    booster::aio::deadline_timer::expires_from_now(pVar3);
    this_00 = local_40;
    mfunc_to_event_handler<cppcms::impl::garbage_collector,cppcms::impl::garbage_collector*>
              ((offset_in_garbage_collector_to_subr)async_run,in_stack_ffffffffffffffa8);
    booster::callback<void(std::error_code_const&)>::
    callback<booster::callable<void(std::error_code_const&)>>
              (this_00,(intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)c);
    booster::aio::deadline_timer::async_wait(c);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x486e11);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&this_00->call_ptr);
    peVar2 = std::
             __shared_ptr_access<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x486e29);
    (*peVar2->_vptr_session_storage_factory[2])();
  }
  return;
}

Assistant:

void async_run(booster::system::error_code const &e)
	{
		if(e) return;
		
		timer_.expires_from_now(booster::ptime::seconds(seconds_));
		timer_.async_wait(mfunc_to_event_handler(&garbage_collector::async_run,this));
		
		io_->gc_job();
	}